

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

CURLcode Curl_ssl_initsessions(Curl_easy *data,size_t amount)

{
  Curl_ssl_session *pCVar1;
  Curl_ssl_session *session;
  size_t amount_local;
  Curl_easy *data_local;
  
  if ((data->state).session == (Curl_ssl_session *)0x0) {
    pCVar1 = (Curl_ssl_session *)(*Curl_ccalloc)(amount,0xb0);
    if (pCVar1 == (Curl_ssl_session *)0x0) {
      data_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      (data->set).general_ssl.max_ssl_sessions = amount;
      (data->state).session = pCVar1;
      (data->state).sessionage = 1;
      data_local._4_4_ = CURLE_OK;
    }
  }
  else {
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_ssl_initsessions(struct Curl_easy *data, size_t amount)
{
  struct Curl_ssl_session *session;

  if(data->state.session)
    /* this is just a precaution to prevent multiple inits */
    return CURLE_OK;

  session = calloc(amount, sizeof(struct Curl_ssl_session));
  if(!session)
    return CURLE_OUT_OF_MEMORY;

  /* store the info in the SSL section */
  data->set.general_ssl.max_ssl_sessions = amount;
  data->state.session = session;
  data->state.sessionage = 1; /* this is brand new */
  return CURLE_OK;
}